

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

uint64_t __thiscall r_exec::Group::get_next_upr_time(Group *this,uint64_t now)

{
  long lVar1;
  ulong uVar2;
  uint64_t uVar3;
  float fVar4;
  
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,1);
  fVar4 = (float)r_code::Atom::asFloat();
  if ((int)(long)fVar4 == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    lVar1 = r_code::Utils::GetBasePeriod();
    uVar2 = lVar1 * ((long)fVar4 & 0xffffffffU);
    lVar1 = r_code::Utils::GetTimeReference();
    uVar3 = (uVar2 + now) - (now - lVar1) % uVar2;
  }
  return uVar3;
}

Assistant:

uint64_t Group::get_next_upr_time(uint64_t now) const
{
    uint64_t __upr = get_upr();

    if (__upr == 0) {
        return Utils::MaxTime;
    }

    uint64_t _upr = __upr * Utils::GetBasePeriod();
    uint64_t delta = (now - Utils::GetTimeReference()) % _upr;
    return now - delta + _upr;
}